

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehavior
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,void *p_v,void *p_min,void *p_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImS32 v32;
  
  switch(data_type) {
  case 0:
    v32 = (ImS32)*p_v;
    bVar1 = SliderBehaviorT<int,int,float>
                      (bb,id,4,&v32,(int)*p_min,(int)*p_max,format,power,flags,out_grab_bb);
    goto LAB_00188896;
  case 1:
    v32 = (ImS32)*p_v;
    bVar1 = SliderBehaviorT<unsigned_int,int,float>
                      (bb,id,5,(uint *)&v32,(uint)*p_min,(uint)*p_max,format,power,flags,out_grab_bb
                      );
LAB_00188896:
    if (bVar1 != false) {
      *(undefined1 *)p_v = (undefined1)v32;
    }
    break;
  case 2:
    v32 = (ImS32)*p_v;
    bVar1 = SliderBehaviorT<int,int,float>
                      (bb,id,4,&v32,(int)*p_min,(int)*p_max,format,power,flags,out_grab_bb);
    goto LAB_0018883a;
  case 3:
    v32 = (ImS32)*p_v;
    bVar1 = SliderBehaviorT<unsigned_int,int,float>
                      (bb,id,5,(uint *)&v32,(uint)*p_min,(uint)*p_max,format,power,flags,out_grab_bb
                      );
LAB_0018883a:
    if (bVar1 != false) {
      *(undefined2 *)p_v = (undefined2)v32;
    }
    break;
  case 4:
    bVar1 = SliderBehaviorT<int,int,float>
                      (bb,id,4,(int *)p_v,*p_min,*p_max,format,power,flags,out_grab_bb);
    break;
  case 5:
    bVar1 = SliderBehaviorT<unsigned_int,int,float>
                      (bb,id,5,(uint *)p_v,*p_min,*p_max,format,power,flags,out_grab_bb);
    break;
  case 6:
    bVar1 = SliderBehaviorT<long_long,long_long,double>
                      (bb,id,6,(longlong *)p_v,*p_min,*p_max,format,power,flags,out_grab_bb);
    break;
  case 7:
    bVar1 = SliderBehaviorT<unsigned_long_long,long_long,double>
                      (bb,id,7,(unsigned_long_long *)p_v,*p_min,*p_max,format,power,flags,
                       out_grab_bb);
    return bVar1;
  case 8:
    bVar1 = SliderBehaviorT<float,float,float>
                      (bb,id,8,(float *)p_v,*p_min,*p_max,format,power,flags,out_grab_bb);
    break;
  case 9:
    bVar1 = SliderBehaviorT<double,double,double>
                      (bb,id,9,(double *)p_v,*p_min,*p_max,format,power,flags,out_grab_bb);
    break;
  default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, void* p_v, const void* p_min, const void* p_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:  { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS8*)p_min,  *(const ImS8*)p_max,  format, power, flags, out_grab_bb); if (r) *(ImS8*)p_v  = (ImS8)v32;  return r; }
    case ImGuiDataType_U8:  { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU8*)p_min,  *(const ImU8*)p_max,  format, power, flags, out_grab_bb); if (r) *(ImU8*)p_v  = (ImU8)v32;  return r; }
    case ImGuiDataType_S16: { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = SliderBehaviorT<ImS32, ImS32, float>(bb, id, ImGuiDataType_S32, &v32, *(const ImS16*)p_min, *(const ImS16*)p_max, format, power, flags, out_grab_bb); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16: { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = SliderBehaviorT<ImU32, ImS32, float>(bb, id, ImGuiDataType_U32, &v32, *(const ImU16*)p_min, *(const ImU16*)p_max, format, power, flags, out_grab_bb); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:
        IM_ASSERT(*(const ImS32*)p_min >= IM_S32_MIN/2 && *(const ImS32*)p_max <= IM_S32_MAX/2);
        return SliderBehaviorT<ImS32, ImS32, float >(bb, id, data_type, (ImS32*)p_v,  *(const ImS32*)p_min,  *(const ImS32*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U32:
        IM_ASSERT(*(const ImU32*)p_max <= IM_U32_MAX/2);
        return SliderBehaviorT<ImU32, ImS32, float >(bb, id, data_type, (ImU32*)p_v,  *(const ImU32*)p_min,  *(const ImU32*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_S64:
        IM_ASSERT(*(const ImS64*)p_min >= IM_S64_MIN/2 && *(const ImS64*)p_max <= IM_S64_MAX/2);
        return SliderBehaviorT<ImS64, ImS64, double>(bb, id, data_type, (ImS64*)p_v,  *(const ImS64*)p_min,  *(const ImS64*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_U64:
        IM_ASSERT(*(const ImU64*)p_max <= IM_U64_MAX/2);
        return SliderBehaviorT<ImU64, ImS64, double>(bb, id, data_type, (ImU64*)p_v,  *(const ImU64*)p_min,  *(const ImU64*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Float:
        IM_ASSERT(*(const float*)p_min >= -FLT_MAX/2.0f && *(const float*)p_max <= FLT_MAX/2.0f);
        return SliderBehaviorT<float, float, float >(bb, id, data_type, (float*)p_v,  *(const float*)p_min,  *(const float*)p_max,  format, power, flags, out_grab_bb);
    case ImGuiDataType_Double:
        IM_ASSERT(*(const double*)p_min >= -DBL_MAX/2.0f && *(const double*)p_max <= DBL_MAX/2.0f);
        return SliderBehaviorT<double,double,double>(bb, id, data_type, (double*)p_v, *(const double*)p_min, *(const double*)p_max, format, power, flags, out_grab_bb);
    case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
    return false;
}